

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_vector.c
# Opt level: O2

exr_result_t
exr_attr_string_vector_add_entry_with_length
          (exr_context_t ctxt,exr_attr_string_vector_t *sv,char *s,int32_t len)

{
  undefined4 *puVar1;
  undefined4 *puVar2;
  int iVar3;
  int iVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  int iVar8;
  exr_result_t eVar9;
  exr_attr_string_t *peVar10;
  long lVar11;
  long lVar12;
  
  if (ctxt == (exr_context_t)0x0) {
    eVar9 = 2;
  }
  else {
    if (sv == (exr_attr_string_vector_t *)0x0) {
      eVar9 = (*ctxt->report_error)(ctxt,3,"Invalid reference to string vector object to assign to")
      ;
      return eVar9;
    }
    iVar3 = sv->n_strings;
    iVar8 = sv->alloc_size;
    if (iVar3 < iVar8) {
      peVar10 = sv->strings;
      iVar8 = iVar3;
    }
    else {
      if (0x7fffffe < iVar8) {
LAB_00111fa4:
        eVar9 = (*ctxt->standard_error)(ctxt,1);
        return eVar9;
      }
      iVar4 = iVar3 + 2;
      if (iVar3 < iVar8 * 2) {
        iVar4 = iVar8 * 2;
      }
      peVar10 = (exr_attr_string_t *)(*ctxt->alloc_fn)((long)iVar4 << 4);
      if (peVar10 == (exr_attr_string_t *)0x0) goto LAB_00111fa4;
      lVar11 = 0;
      for (lVar12 = 0; iVar8 = sv->n_strings, lVar12 < iVar8; lVar12 = lVar12 + 1) {
        puVar1 = (undefined4 *)((long)&sv->strings->length + lVar11);
        uVar5 = puVar1[1];
        uVar6 = puVar1[2];
        uVar7 = puVar1[3];
        puVar2 = (undefined4 *)((long)&peVar10->length + lVar11);
        *puVar2 = *puVar1;
        puVar2[1] = uVar5;
        puVar2[2] = uVar6;
        puVar2[3] = uVar7;
        lVar11 = lVar11 + 0x10;
      }
      if (0 < sv->alloc_size) {
        (*ctxt->free_fn)(sv->strings);
        iVar8 = sv->n_strings;
      }
      sv->strings = peVar10;
      sv->alloc_size = iVar4;
    }
    eVar9 = exr_attr_string_create_with_length(ctxt,peVar10 + iVar8,s,len);
    if (eVar9 == 0) {
      sv->n_strings = iVar3 + 1;
      eVar9 = 0;
    }
  }
  return eVar9;
}

Assistant:

exr_result_t
exr_attr_string_vector_add_entry_with_length (
    exr_context_t             ctxt,
    exr_attr_string_vector_t* sv,
    const char*               s,
    int32_t                   len)
{
    int32_t            nent;
    int                rv;
    exr_attr_string_t* nlist;

    if (!ctxt) return EXR_ERR_MISSING_CONTEXT_ARG;

    if (!sv)
        return ctxt->report_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid reference to string vector object to assign to");

    nent = sv->n_strings + 1;
    if (nent > sv->alloc_size)
    {
        size_t  bytes;
        int32_t allsz = sv->alloc_size * 2;

        if (sv->alloc_size >= (INT32_MAX / (int) sizeof (exr_attr_string_t)))
            return ctxt->standard_error (ctxt, EXR_ERR_OUT_OF_MEMORY);

        if (nent > allsz) allsz = nent + 1;
        bytes = ((size_t) allsz) * sizeof (exr_attr_string_t);
        nlist = (exr_attr_string_t*) ctxt->alloc_fn (bytes);
        if (nlist == NULL)
            return ctxt->standard_error (ctxt, EXR_ERR_OUT_OF_MEMORY);

        for (int32_t i = 0; i < sv->n_strings; ++i)
            *(nlist + i) = sv->strings[i];

        if (sv->alloc_size > 0)
            ctxt->free_fn (EXR_CONST_CAST (void*, sv->strings));
        sv->strings    = nlist;
        sv->alloc_size = allsz;
    }
    else
    {
        /* that means we own this and can write into, cast away const */
        nlist = EXR_CONST_CAST (exr_attr_string_t*, sv->strings);
    }

    rv = exr_attr_string_create_with_length (
        ctxt, nlist + sv->n_strings, s, len);
    if (rv == EXR_ERR_SUCCESS) sv->n_strings = nent;
    return rv;
}